

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::ResizeInternalTestLarge_TestInternalResizeChangeConfig_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::ResizeInternalTestLarge_TestInternalResizeChangeConfig_Test>
             *this)

{
  ResizeInternalTestLarge *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode>>::parameter_
       = &this->parameter_;
  this_00 = (ResizeInternalTestLarge *)operator_new(0x420);
  anon_unknown.dwarf_135799e::ResizeInternalTestLarge::ResizeInternalTestLarge(this_00);
  (this_00->super_ResizeTest).super_CodecTestWithParam<libaom_test::TestMode>.
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_Test._vptr_Test = (_func_int **)&PTR__ResizeTest_00f353a8;
  (this_00->super_ResizeTest).super_CodecTestWithParam<libaom_test::TestMode>.
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  _vptr_WithParamInterface =
       (_func_int **)&PTR__ResizeInternalTestLarge_TestInternalResizeChangeConfig_Test_00f35410;
  (this_00->super_ResizeTest).super_EncoderTest._vptr_EncoderTest =
       (_func_int **)&PTR__ResizeInternalTestLarge_TestInternalResizeChangeConfig_Test_00f35430;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }